

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_matrix.cpp
# Opt level: O0

longdouble * __thiscall
neural_networks::utilities::Neuron::activation_function_prime
          (longdouble *__return_storage_ptr__,Neuron *this,longdouble input)

{
  longdouble *plVar1;
  longdouble input_local;
  Neuron *this_local;
  
  activation_function(__return_storage_ptr__,this,input);
  plVar1 = activation_function(__return_storage_ptr__,this,input);
  return plVar1;
}

Assistant:

const long double neural_networks::utilities::Neuron::activation_function_prime(const long double input) const {
    return neural_networks::utilities::Neuron::activation_function(input) *
           (1 - neural_networks::utilities::Neuron::activation_function(input));
}